

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void QHashPrivate::Node<QString,QVariant>::createInPlace<QVariant_const&>
               (Node<QString,_QVariant> *n,QString *k,QVariant *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  
  pDVar1 = (k->d).d;
  (k->d).d = (Data *)0x0;
  (n->key).d.d = pDVar1;
  pcVar2 = (k->d).ptr;
  (k->d).ptr = (char16_t *)0x0;
  (n->key).d.ptr = pcVar2;
  qVar3 = (k->d).size;
  (k->d).size = 0;
  (n->key).d.size = qVar3;
  ::QVariant::QVariant(&n->value,args);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }